

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3IsLikeFunction(sqlite3 *db,Expr *pExpr,int *pIsNocase,char *aWc)

{
  char *zName;
  undefined2 *puVar1;
  int nName;
  FuncDef *pFVar2;
  FuncDef *pDef;
  char *aWc_local;
  int *pIsNocase_local;
  Expr *pExpr_local;
  sqlite3 *db_local;
  
  if (((pExpr->op == 0x97) && ((pExpr->x).pList != (ExprList *)0x0)) &&
     (((pExpr->x).pList)->nExpr == 2)) {
    zName = (pExpr->u).zToken;
    nName = sqlite3Strlen30((pExpr->u).zToken);
    pFVar2 = sqlite3FindFunction(db,zName,nName,2,'\x01','\0');
    if ((pFVar2 == (FuncDef *)0x0) || ((pFVar2->flags & 1) == 0)) {
      db_local._4_4_ = 0;
    }
    else {
      puVar1 = (undefined2 *)pFVar2->pUserData;
      *(undefined2 *)aWc = *puVar1;
      aWc[2] = *(char *)(puVar1 + 1);
      *pIsNocase = (uint)((pFVar2->flags & 2) == 0);
      db_local._4_4_ = 1;
    }
  }
  else {
    db_local._4_4_ = 0;
  }
  return db_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3IsLikeFunction(sqlite3 *db, Expr *pExpr, int *pIsNocase, char *aWc){
  FuncDef *pDef;
  if( pExpr->op!=TK_FUNCTION 
   || !pExpr->x.pList 
   || pExpr->x.pList->nExpr!=2
  ){
    return 0;
  }
  assert( !ExprHasProperty(pExpr, EP_xIsSelect) );
  pDef = sqlite3FindFunction(db, pExpr->u.zToken, 
                             sqlite3Strlen30(pExpr->u.zToken),
                             2, SQLITE_UTF8, 0);
  if( NEVER(pDef==0) || (pDef->flags & SQLITE_FUNC_LIKE)==0 ){
    return 0;
  }

  /* The memcpy() statement assumes that the wildcard characters are
  ** the first three statements in the compareInfo structure.  The
  ** asserts() that follow verify that assumption
  */
  memcpy(aWc, pDef->pUserData, 3);
  assert( (char*)&likeInfoAlt == (char*)&likeInfoAlt.matchAll );
  assert( &((char*)&likeInfoAlt)[1] == (char*)&likeInfoAlt.matchOne );
  assert( &((char*)&likeInfoAlt)[2] == (char*)&likeInfoAlt.matchSet );
  *pIsNocase = (pDef->flags & SQLITE_FUNC_CASE)==0;
  return 1;
}